

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_sptfqmr.c
# Opt level: O1

int SUNLinSolSetATimes_SPTFQMR(SUNLinearSolver S,void *ATData,ATimesFn ATimes)

{
  void *pvVar1;
  
  if (S != (SUNLinearSolver)0x0) {
    pvVar1 = S->content;
    *(ATimesFn *)((long)pvVar1 + 0x20) = ATimes;
    *(void **)((long)pvVar1 + 0x28) = ATData;
    *(undefined8 *)((long)pvVar1 + 0x18) = 0;
    return 0;
  }
  return -1;
}

Assistant:

int SUNLinSolSetATimes_SPTFQMR(SUNLinearSolver S, void* ATData, 
                               ATimesFn ATimes)
{
  /* set function pointers to integrator-supplied ATimes routine
     and data, and return with success */
  if (S == NULL) return(SUNLS_MEM_NULL);
  SPTFQMR_CONTENT(S)->ATimes = ATimes;
  SPTFQMR_CONTENT(S)->ATData = ATData;
  LASTFLAG(S) = SUNLS_SUCCESS;
  return(LASTFLAG(S));
}